

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var1;
  pointer psVar2;
  size_type sVar3;
  bool bVar4;
  type tVar5;
  bool bVar6;
  Classifier CVar7;
  HorribleError *pHVar8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var9;
  size_t sVar10;
  long lVar11;
  App *pAVar12;
  ArgumentMismatch *pAVar13;
  int num;
  Option *pOVar14;
  pointer pbVar15;
  int iVar16;
  pointer psVar17;
  int local_3e8;
  string narg_name;
  allocator local_3b9;
  App *sub;
  string nvalue;
  int result_count;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_370;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_368;
  string arg_name;
  string rest;
  string value;
  string current;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  anon_class_32_1_6b09f7e2_for__M_pred local_1d8;
  anon_class_40_2_a297e68f_for__M_pred local_1b8;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  ::std::__cxx11::string::string
            ((string *)&current,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish + -1));
  arg_name._M_dataplus._M_p = (pointer)&arg_name.field_2;
  arg_name._M_string_length = 0;
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  rest._M_dataplus._M_p = (pointer)&rest.field_2;
  rest._M_string_length = 0;
  arg_name.field_2._M_local_buf[0] = '\0';
  value.field_2._M_local_buf[0] = '\0';
  rest.field_2._M_local_buf[0] = '\0';
  if (current_type == SHORT) {
    bVar4 = detail::split_short(&current,&arg_name,&rest);
    if (!bVar4) {
      pHVar8 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_b0,"Short parsed but missing! You should not see this",
                 (allocator *)&narg_name);
      HorribleError::HorribleError(pHVar8,&local_b0);
      __cxa_throw(pHVar8,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else if (current_type == WINDOWS_STYLE) {
    bVar4 = detail::split_windows_style(&current,&arg_name,&value);
    if (!bVar4) {
      pHVar8 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_d0,"windows option parsed but missing! You should not see this",
                 (allocator *)&narg_name);
      HorribleError::HorribleError(pHVar8,&local_d0);
      __cxa_throw(pHVar8,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (current_type != LONG) {
      pHVar8 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_f0,
                 "parsing got called with invalid option! You should not see this",
                 (allocator *)&narg_name);
      HorribleError::HorribleError(pHVar8,&local_f0);
      __cxa_throw(pHVar8,&HorribleError::typeinfo,Error::~Error);
    }
    bVar4 = detail::split_long(&current,&arg_name,&value);
    if (!bVar4) {
      pHVar8 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_90,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar8,&local_90);
      __cxa_throw(pHVar8,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var9._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var1._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::string((string *)&local_1b8,(string *)&arg_name);
  local_1b8.current_type = current_type;
  _Var9 = ::std::
          find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                    (_Var9,_Var1,&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  if (_Var9._M_current ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar2 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar17 = (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar2;
        psVar17 = psVar17 + 1) {
      pAVar12 = (psVar17->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((pAVar12->name_)._M_string_length == 0) && (pAVar12->disabled_ == false)) &&
         (bVar4 = _parse_arg(pAVar12,args,current_type,param_3), bVar4)) {
        pAVar12 = (psVar17->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar4 = true;
        if (pAVar12->pre_parse_called_ == false) {
          _trigger_pre_parse(pAVar12,(long)(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 5);
        }
        goto LAB_0012961e;
      }
    }
    if (((current_type == SHORT) && (this->allow_non_standard_options_ != false)) &&
       (2 < current._M_string_length)) {
      narg_name._M_dataplus._M_p = (pointer)&narg_name.field_2;
      narg_name._M_string_length = 0;
      narg_name.field_2._M_local_buf[0] = '\0';
      nvalue._M_dataplus._M_p = (pointer)&nvalue.field_2;
      nvalue._M_string_length = 0;
      nvalue.field_2._M_local_buf[0] = '\0';
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      local_2d8.field_2._M_allocated_capacity._0_2_ = 0x2d;
      local_2d8._M_string_length = 1;
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &result_count,&local_2d8,&current);
      detail::split_long((string *)&result_count,&narg_name,&nvalue);
      ::std::__cxx11::string::~string((string *)&result_count);
      ::std::__cxx11::string::~string((string *)&local_2d8);
      _Var9._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      _Var1._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::string((string *)&local_1d8,(string *)&narg_name);
      _Var9 = ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                        (_Var9,_Var1,&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      if (_Var9._M_current !=
          (this->options_).
          super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::__cxx11::string::_M_assign((string *)&arg_name);
        ::std::__cxx11::string::_M_assign((string *)&value);
        rest._M_string_length = 0;
        *rest._M_dataplus._M_p = '\0';
        ::std::__cxx11::string::~string((string *)&nvalue);
        ::std::__cxx11::string::~string((string *)&narg_name);
        goto LAB_00128e36;
      }
      ::std::__cxx11::string::~string((string *)&nvalue);
      ::std::__cxx11::string::~string((string *)&narg_name);
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      lVar11 = ::std::__cxx11::string::find((char)&arg_name,0x2e);
      if (lVar11 != -1) {
        ::std::__cxx11::string::substr((ulong)&narg_name,(ulong)&arg_name);
        pAVar12 = _find_subcommand(this,&narg_name,true,false);
        ::std::__cxx11::string::~string((string *)&narg_name);
        sub = pAVar12;
        if (pAVar12 != (App *)0x0) {
          ::std::__cxx11::string::string
                    ((string *)&narg_name,
                     (string *)
                     ((args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(args);
          ::std::__cxx11::string::substr((ulong)&nvalue,(ulong)&arg_name);
          ::std::__cxx11::string::operator=((string *)&arg_name,(string *)&nvalue);
          ::std::__cxx11::string::~string((string *)&nvalue);
          if (arg_name._M_string_length < 2) {
            ::std::__cxx11::string::substr((ulong)&nvalue,(ulong)&narg_name);
            *nvalue._M_dataplus._M_p = '-';
            if (2 < nvalue._M_string_length) {
              ::std::__cxx11::string::substr((ulong)&result_count,(ulong)&nvalue);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result_count);
              ::std::__cxx11::string::~string((string *)&result_count);
              ::std::__cxx11::string::resize((ulong)&nvalue);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,&nvalue);
            ::std::__cxx11::string::~string((string *)&nvalue);
            current_type = SHORT;
          }
          else {
            ::std::__cxx11::string::string((string *)&result_count,"--",&local_3b9);
            ::std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&narg_name);
            ::std::operator+(&nvalue,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&result_count,&local_2d8);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                       &nvalue);
            ::std::__cxx11::string::~string((string *)&nvalue);
            ::std::__cxx11::string::~string((string *)&local_2d8);
            ::std::__cxx11::string::~string((string *)&result_count);
            current_type = LONG;
          }
          bVar6 = _parse_arg(pAVar12,args,current_type,true);
          if (bVar6) {
            if (pAVar12->silent_ == false) {
              std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                        (&this->parsed_subcommands_,&sub);
            }
            increment_parsed(this);
            _trigger_pre_parse(this,(long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5);
            if ((sub->parse_complete_callback_).super__Function_base._M_manager !=
                (_Manager_type)0x0) {
              _process_env(sub);
              _process_callbacks(sub);
              _process_help_flags(sub,false,false);
              _process_requirements(sub);
              run_callback(sub,false,true);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(args);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,&narg_name);
          }
          ::std::__cxx11::string::~string((string *)&narg_name);
          bVar4 = true;
          if (bVar6) goto LAB_0012961e;
        }
      }
      if (!param_3) {
        if ((this->parent_ == (App *)0x0) || (this->fallthrough_ != true)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(args);
          bVar4 = true;
          _move_to_missing(this,current_type,&current);
        }
        else {
          pAVar12 = _get_fallthrough_parent(this);
          bVar4 = _parse_arg(pAVar12,args,current_type,false);
        }
        goto LAB_0012961e;
      }
    }
    bVar4 = false;
    goto LAB_0012961e;
  }
LAB_00128e36:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(args);
  pOVar14 = ((_Var9._M_current)->_M_t).
            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (((pOVar14->inject_separator_ == true) &&
      (pbVar15 = *(pointer *)
                  ((long)&(pOVar14->results_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 8),
      (pOVar14->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar15)) && (pbVar15[-1]._M_string_length != 0))
  {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    Option::add_result(pOVar14,&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    pOVar14 = ((_Var9._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  if ((pOVar14->trigger_on_result_ == true) && (pOVar14->current_option_state_ == callback_run)) {
    Option::clear(pOVar14);
    pOVar14 = ((_Var9._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  iVar16 = pOVar14->type_size_min_;
  num = pOVar14->expected_min_ * iVar16;
  if (iVar16 <= num) {
    num = iVar16;
  }
  local_3e8 = Option::get_items_expected_max(pOVar14);
  if (local_3e8 < 0x2000000) {
LAB_00128f70:
    result_count = 0;
    if (local_3e8 != 0) goto LAB_0012917d;
    pOVar14 = ((_Var9._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_218,(string *)&value);
    Option::get_flag_value(&narg_name,pOVar14,&arg_name,&local_218);
    ::std::__cxx11::string::~string((string *)&local_218);
    pOVar14 = ((_Var9._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_238,(string *)&narg_name);
    Option::add_result(pOVar14,&local_238);
    ::std::__cxx11::string::~string((string *)&local_238);
    nvalue._M_dataplus._M_p =
         (pointer)((_Var9._M_current)->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
               (Option **)&nvalue);
    ::std::__cxx11::string::~string((string *)&narg_name);
    local_3e8 = 0;
LAB_00129256:
    iVar16 = 0;
  }
  else {
    pOVar14 = ((_Var9._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar14->allow_extra_args_ == false) {
      narg_name._M_dataplus._M_p._0_4_ = pOVar14->type_size_max_;
      tVar5 = detail::checked_multiply<int>((int *)&narg_name,pOVar14->expected_min_);
      local_3e8 = 0x20000000;
      if (tVar5) {
        local_3e8 = (int)narg_name._M_dataplus._M_p;
        goto LAB_00128f70;
      }
    }
LAB_0012917d:
    result_count = 0;
    if (value._M_string_length == 0) {
      if (rest._M_string_length == 0) goto LAB_00129256;
      pOVar14 = ((_Var9._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_278,(string *)&rest);
      Option::add_result(pOVar14,&local_278,&result_count);
      ::std::__cxx11::string::~string((string *)&local_278);
      narg_name._M_dataplus._M_p =
           (pointer)((_Var9._M_current)->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)&narg_name);
      ::std::__cxx11::string::assign((char *)&rest);
      iVar16 = result_count;
    }
    else {
      pOVar14 = ((_Var9._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_258,(string *)&value);
      Option::add_result(pOVar14,&local_258,&result_count);
      ::std::__cxx11::string::~string((string *)&local_258);
      narg_name._M_dataplus._M_p =
           (pointer)((_Var9._M_current)->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)&narg_name);
      iVar16 = result_count;
    }
  }
  local_368 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
  while (iVar16 < num) {
    pbVar15 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start == pbVar15) {
      pAVar13 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      Option::get_name_abi_cxx11_
                (&local_110,
                 ((_Var9._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
      Option::get_type_name_abi_cxx11_
                (&local_130,
                 ((_Var9._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      ArgumentMismatch::TypedAtLeast(pAVar13,&local_110,num,&local_130);
      __cxa_throw(pAVar13,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::string((string *)&narg_name,(string *)(pbVar15 + -1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(args);
    pOVar14 = ((_Var9._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_50,(string *)&narg_name);
    Option::add_result(pOVar14,&local_50,&result_count);
    ::std::__cxx11::string::~string((string *)&local_50);
    nvalue._M_dataplus._M_p =
         (pointer)((_Var9._M_current)->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              (local_368,(Option **)&nvalue);
    iVar16 = iVar16 + result_count;
    ::std::__cxx11::string::~string((string *)&narg_name);
  }
  if ((iVar16 < local_3e8) ||
     (pOVar14 = ((_Var9._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
     pOVar14->allow_extra_args_ == true)) {
    sVar10 = _count_remaining_positionals(this,true);
    local_370 = _Var9._M_current;
    while ((iVar16 < local_3e8 ||
           ((((_Var9._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ != false))
          ) {
      pbVar15 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar15) goto LAB_00129471;
      CVar7 = _recognize(this,pbVar15 + -1,false);
      pbVar15 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((CVar7 != NONE) ||
         ((ulong)((long)pbVar15 -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= sVar10))
      goto LAB_00129471;
      if (this->validate_optional_arguments_ == true) {
        ::std::__cxx11::string::string((string *)&narg_name,(string *)(pbVar15 + -1));
        Option::_validate(&nvalue,(local_370->_M_t).
                                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                  .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                          &narg_name,0);
        ::std::__cxx11::string::operator=((string *)&narg_name,(string *)&nvalue);
        ::std::__cxx11::string::~string((string *)&nvalue);
        sVar3 = narg_name._M_string_length;
        ::std::__cxx11::string::~string((string *)&narg_name);
        pbVar15 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        _Var9._M_current = local_370;
        if (sVar3 != 0) goto LAB_00129471;
      }
      pOVar14 = ((_Var9._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_70,(string *)(pbVar15 + -1));
      Option::add_result(pOVar14,&local_70,&result_count);
      ::std::__cxx11::string::~string((string *)&local_70);
      narg_name._M_dataplus._M_p =
           (pointer)((_Var9._M_current)->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                (local_368,(Option **)&narg_name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      iVar16 = iVar16 + result_count;
    }
    pbVar15 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
LAB_00129471:
    if (((args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start != pbVar15) &&
       (CVar7 = _recognize(this,pbVar15 + -1,true), CVar7 == POSITIONAL_MARK)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
    }
    pOVar14 = ((_Var9._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((0 < local_3e8) && (iVar16 == 0 && num == 0)) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      Option::get_flag_value(&narg_name,pOVar14,&arg_name,&local_150);
      ::std::__cxx11::string::~string((string *)&local_150);
      pOVar14 = (local_370->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_298,(string *)&narg_name);
      Option::add_result(pOVar14,&local_298);
      ::std::__cxx11::string::~string((string *)&local_298);
      _Var9._M_current = local_370;
      nvalue._M_dataplus._M_p =
           (pointer)(local_370->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                (local_368,(Option **)&nvalue);
      ::std::__cxx11::string::~string((string *)&narg_name);
      pOVar14 = ((_Var9._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    }
  }
  if ((0 < num) && (iVar16 % pOVar14->type_size_max_ != 0)) {
    if (pOVar14->type_size_max_ == pOVar14->type_size_min_) {
      pAVar13 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      Option::get_name_abi_cxx11_
                (&local_170,
                 ((_Var9._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
      pOVar14 = ((_Var9._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar16 = pOVar14->type_size_min_;
      Option::get_type_name_abi_cxx11_(&local_190,pOVar14);
      ArgumentMismatch::PartialType(pAVar13,&local_170,iVar16,&local_190);
      __cxa_throw(pAVar13,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    Option::add_result(pOVar14,&local_2b8);
    ::std::__cxx11::string::~string((string *)&local_2b8);
    pOVar14 = ((_Var9._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  if (pOVar14->trigger_on_result_ == true) {
    Option::run_callback(pOVar14);
  }
  if (rest._M_string_length != 0) {
    ::std::operator+(&narg_name,"-",&rest);
    ::std::__cxx11::string::operator=((string *)&rest,(string *)&narg_name);
    ::std::__cxx11::string::~string((string *)&narg_name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&rest);
  }
  bVar4 = true;
LAB_0012961e:
  ::std::__cxx11::string::~string((string *)&rest);
  ::std::__cxx11::string::~string((string *)&value);
  ::std::__cxx11::string::~string((string *)&arg_name);
  ::std::__cxx11::string::~string((string *)&current);
  return bVar4;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                auto val = sub->_parse_arg(args, current_type, true);
                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}